

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

ssize_t Curl_recv_plain(Curl_easy *data,int num,char *buf,size_t len,CURLcode *code)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  char local_158 [8];
  char buffer [256];
  int err;
  ssize_t nread;
  curl_socket_t sockfd;
  connectdata *conn;
  CURLcode *code_local;
  size_t len_local;
  char *buf_local;
  int num_local;
  Curl_easy *data_local;
  
  sVar1 = recv(data->conn->sock[num],buf,len,0);
  *code = CURLE_OK;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    buffer._252_4_ = *piVar2;
    if (((buffer._252_4_ == 0xb) || (buffer._252_4_ == 0xb)) || (buffer._252_4_ == 4)) {
      *code = CURLE_AGAIN;
    }
    else {
      pcVar3 = Curl_strerror(buffer._252_4_,local_158,0x100);
      Curl_failf(data,"Recv failure: %s",pcVar3);
      (data->state).os_errno = buffer._252_4_;
      *code = CURLE_RECV_ERROR;
    }
  }
  return sVar1;
}

Assistant:

ssize_t Curl_recv_plain(struct Curl_easy *data, int num, char *buf,
                        size_t len, CURLcode *code)
{
  struct connectdata *conn;
  curl_socket_t sockfd;
  ssize_t nread;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
  sockfd = conn->sock[num];
  /* Check and return data that already received and storied in internal
     intermediate buffer */
  nread = get_pre_recved(conn, num, buf, len);
  if(nread > 0) {
    *code = CURLE_OK;
    return nread;
  }

  nread = sread(sockfd, buf, len);

  *code = CURLE_OK;
  if(-1 == nread) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *code = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(data, "Recv failure: %s",
            Curl_strerror(err, buffer, sizeof(buffer)));
      data->state.os_errno = err;
      *code = CURLE_RECV_ERROR;
    }
  }
  return nread;
}